

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

void __thiscall
OptionParser::setOption(OptionParser *this,string *keyword,string *value,Network *network)

{
  int iVar1;
  bool bVar2;
  InputError *pIVar3;
  string local_e0 [32];
  double local_c0;
  double x;
  string local_b0 [39];
  undefined1 local_89;
  string local_88 [36];
  int local_64;
  undefined1 local_5d;
  int err_1;
  string local_50 [32];
  int local_30;
  StringOption local_2c;
  int err;
  int option;
  Network *network_local;
  string *value_local;
  string *keyword_local;
  OptionParser *this_local;
  
  _err = network;
  network_local = (Network *)value;
  value_local = keyword;
  keyword_local = (string *)this;
  local_2c = Utilities::findFullMatch(keyword,stringOptionKeywords);
  if ((int)local_2c < 0) {
    local_2c = Utilities::findFullMatch(value_local,indexOptionKeywords);
    if ((int)local_2c < 0) {
      local_2c = Utilities::findFullMatch(value_local,valueOptionKeywords);
      if ((int)local_2c < 0) {
        x._7_1_ = 1;
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_b0,(string *)value_local);
        InputError::InputError(pIVar3,3,(string *)local_b0);
        x._7_1_ = 0;
        __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
      }
      bVar2 = Utilities::parseNumber<double>((string *)network_local,&local_c0);
      if (!bVar2) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_e0,(string *)network_local);
        InputError::InputError(pIVar3,6,(string *)local_e0);
        __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
      }
      Options::setOption(&_err->options,local_2c,local_c0);
    }
    else {
      local_64 = Options::setOption(&_err->options,local_2c,(string *)network_local,_err);
      if (local_64 != 0) {
        local_89 = 1;
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        iVar1 = local_64;
        std::__cxx11::string::string(local_88,(string *)network_local);
        InputError::InputError(pIVar3,iVar1,(string *)local_88);
        local_89 = 0;
        __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
      }
    }
  }
  else {
    local_30 = Options::setOption(&_err->options,local_2c,(string *)network_local);
    if (local_30 != 0) {
      local_5d = 1;
      pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
      iVar1 = local_30;
      std::__cxx11::string::string(local_50,(string *)network_local);
      InputError::InputError(pIVar3,iVar1,(string *)local_50);
      local_5d = 0;
      __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
    }
  }
  return;
}

Assistant:

void OptionParser::setOption(const string& keyword, const string& value,
                             Network* network)
{
    // ... try to assign value to a string option

    int option = Utilities::findFullMatch(keyword, stringOptionKeywords);
    if ( option >=  0 )
    {
        int err = network->options.setOption(
                      (Options::StringOption)option, value);
        if ( err ) throw InputError(err, value);
        return;
    }

    // ... try to assign value to a category option

    option = Utilities::findFullMatch(keyword, indexOptionKeywords);
    if ( option >= 0 )
    {
        int err = network->options.setOption(
                      (Options::IndexOption)option, value, network);
        if ( err ) throw InputError(err, value);
        return;
    }

    // ... try to assign value to a value option

    option = Utilities::findFullMatch(keyword, valueOptionKeywords);
    if ( option < 0 ) throw InputError(InputError::INVALID_KEYWORD, keyword);
    double x;
    if (!Utilities::parseNumber(value, x))
    {
        throw InputError(InputError::INVALID_NUMBER, value);
    }
    network->options.setOption((Options::ValueOption)option, x);
}